

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mergesort_lcp.cpp
# Opt level: O2

void merge_cache_lcp_2way<false,unsigned_short>
               (uchar **from0,lcp_t *lcp_input0,unsigned_short *cache_input0,size_t n0,uchar **from1
               ,lcp_t *lcp_input1,unsigned_short *cache_input1,size_t n1,uchar **result,
               lcp_t *lcp_result,unsigned_short *cache_result)

{
  lcp_t lVar1;
  ulong uVar2;
  uchar **ppuVar3;
  ushort b;
  ushort a;
  int iVar4;
  uint uVar5;
  ulong lcp0;
  uchar **__dest;
  lcp_t *local_90;
  uint16_t *local_88;
  size_t local_78;
  uchar **local_70;
  ulong *local_68;
  ulong local_60;
  unsigned_short *local_58;
  size_t local_50;
  size_t local_40;
  int local_38;
  
  check_input<unsigned_short>(from0,lcp_input0,cache_input0,n0);
  local_50 = n1;
  check_input<unsigned_short>(from1,lcp_input1,cache_input1,n1);
  local_88 = cache_input0 + 1;
  a = *cache_input0;
  local_58 = cache_input1 + 1;
  b = *cache_input1;
  local_68 = lcp_input1;
  if (a < b) {
    iVar4 = cmp(*from0,*from1);
    if (-1 < iVar4) {
      __assert_fail("cmp(*from0, *from1) < 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x449,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                   );
    }
    uVar5 = lcp(a,b);
    if (uVar5 != 0) {
      b = get_char<unsigned_short>(*from1,1);
    }
    *result = *from0;
    if (n0 == 1) {
LAB_001ce813:
      __dest = result + 1;
      ppuVar3 = from1;
      goto LAB_001ce816;
    }
    lcp0 = *lcp_input0;
    a = cache_input0[1];
LAB_001ce261:
    local_70 = from0 + 1;
    local_78 = n0 - 1;
    local_90 = lcp_input0 + 1;
    local_88 = cache_input0 + 2;
    local_60 = (ulong)uVar5;
LAB_001ce302:
    __dest = result + 1;
    do {
      while( true ) {
        check_lcp_and_cache<unsigned_short>(__dest[-1],*local_70,lcp0,a,*from1,local_60,b);
        if (lcp0 <= local_60) break;
        iVar4 = cmp(*local_70,*from1);
        if (-1 < iVar4) {
          __assert_fail("cmp(*from0, *from1) < 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x4ae,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                       );
        }
        *__dest = *local_70;
        a = *local_88;
        lVar1 = *local_90;
joined_r0x001ce6a2:
        lcp0 = lVar1;
        local_88 = local_88 + 1;
        local_90 = local_90 + 1;
        __dest = __dest + 1;
        local_70 = local_70 + 1;
        local_78 = local_78 - 1;
        ppuVar3 = from1;
        if (local_78 == 0) goto LAB_001ce816;
      }
      if (local_60 <= lcp0) {
        if (a < b) {
          iVar4 = cmp(*local_70,*from1);
          if (-1 < iVar4) {
            __assert_fail("cmp(*from0, *from1) < 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x4c6,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                         );
          }
          uVar5 = lcp(a,b);
          if (uVar5 != 0) {
            local_60 = local_60 + 1;
            b = get_char<unsigned_short>(*from1,local_60);
          }
          *__dest = *local_70;
          a = *local_88;
          lVar1 = *local_90;
        }
        else {
          if (b < a) {
            iVar4 = cmp(*local_70,*from1);
            if (iVar4 < 1) {
              __assert_fail("cmp(*from0, *from1) > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4d6,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                           );
            }
            uVar5 = lcp(a,b);
            if (uVar5 != 0) {
              lcp0 = lcp0 + 1;
              a = get_char<unsigned_short>(*local_70,lcp0);
            }
            *__dest = *from1;
            local_60 = *local_68;
            b = *local_58;
            goto joined_r0x001ce648;
          }
          if ((char)a == '\0') {
            iVar4 = cmp(*local_70,*from1);
            if (iVar4 != 0) {
              __assert_fail("cmp(*from0, *from1) == 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                            ,0x4e7,
                            "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                           );
            }
            *__dest = *local_70;
            lVar1 = *local_90;
            uVar5 = lcp(a,b);
            a = *local_88;
            b = 0;
            local_60 = local_60 + uVar5;
          }
          else {
            compare((uchar *)&local_40,*local_70,(size_t)*from1);
            lcp0 = local_40;
            local_60 = lcp0;
            if (local_38 < 0) {
              *__dest = *local_70;
              lVar1 = *local_90;
              a = *local_88;
              b = get_char<unsigned_short>(*from1,local_40);
            }
            else {
              if (local_38 != 0) {
                *__dest = *from1;
                local_60 = *local_68;
                a = get_char<unsigned_short>(*local_70,local_40);
                b = *local_58;
                goto joined_r0x001ce648;
              }
              *__dest = *local_70;
              a = *local_88;
              b = 0;
              lVar1 = *local_90;
            }
          }
        }
        goto joined_r0x001ce6a2;
      }
      iVar4 = cmp(*local_70,*from1);
      if (iVar4 < 1) {
        __assert_fail("cmp(*from0, *from1) > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                      ,0x4b7,
                      "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                     );
      }
      *__dest = *from1;
      local_60 = *local_68;
      b = *local_58;
joined_r0x001ce648:
      local_58 = local_58 + 1;
      local_68 = local_68 + 1;
      from1 = from1 + 1;
      __dest = __dest + 1;
      local_50 = local_50 - 1;
      from0 = local_70;
    } while (local_50 != 0);
  }
  else {
    local_78 = n0;
    local_90 = lcp_input0;
    local_70 = from0;
    if (a <= b) {
      if ((char)a == '\0') {
        iVar4 = cmp(*from0,*from1);
        if (iVar4 != 0) {
          __assert_fail("cmp(*from0, *from1) == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                        ,0x470,
                        "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                       );
        }
        uVar5 = lcp(a,b);
        *result = *from0;
        if (n0 == 1) goto LAB_001ce813;
        lcp0 = *lcp_input0;
        a = cache_input0[1];
        b = 0;
        goto LAB_001ce261;
      }
      compare((uchar *)&local_40,*from0,(size_t)*from1);
      local_60 = local_40;
      if (local_38 < 0) {
        *result = *from0;
        __dest = result + 1;
        lcp0 = *lcp_input0;
        a = cache_input0[1];
        b = get_char<unsigned_short>(*from1,local_40);
        local_78 = n0 - 1;
        ppuVar3 = from1;
        if (local_78 == 0) {
LAB_001ce816:
          from0 = ppuVar3;
          local_78 = local_50;
          if (local_50 == 0) {
            __assert_fail("n1",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                          ,0x51e,
                          "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                         );
          }
          goto LAB_001ce84b;
        }
        local_70 = from0 + 1;
        local_90 = lcp_input0 + 1;
        local_88 = cache_input0 + 2;
      }
      else {
        __dest = result + 1;
        if (local_38 == 0) {
          *result = *from0;
          local_78 = n0 - 1;
          ppuVar3 = from1;
          if (local_78 == 0) goto LAB_001ce816;
          local_70 = from0 + 1;
          lcp0 = *lcp_input0;
          local_90 = lcp_input0 + 1;
          a = cache_input0[1];
          local_88 = cache_input0 + 2;
          b = 0;
        }
        else {
          *result = *from1;
          uVar2 = *lcp_input1;
          a = get_char<unsigned_short>(*from0,local_40);
          local_50 = n1 - 1;
          if (local_50 == 0) goto LAB_001ce833;
          from1 = from1 + 1;
          local_68 = lcp_input1 + 1;
          b = cache_input1[1];
          local_58 = cache_input1 + 2;
          lcp0 = local_60;
          local_60 = uVar2;
        }
      }
      goto LAB_001ce302;
    }
    iVar4 = cmp(*from0,*from1);
    if (iVar4 < 1) {
      __assert_fail("cmp(*from0, *from1) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                    ,0x45c,
                    "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                   );
    }
    uVar5 = lcp(a,b);
    if (uVar5 != 0) {
      a = get_char<unsigned_short>(*from0,1);
    }
    *result = *from1;
    __dest = result + 1;
    local_50 = n1 - 1;
    if (local_50 != 0) {
      from1 = from1 + 1;
      local_68 = lcp_input1 + 1;
      b = cache_input1[1];
      local_58 = cache_input1 + 2;
      lcp0 = (ulong)uVar5;
      local_60 = *lcp_input1;
      goto LAB_001ce302;
    }
  }
LAB_001ce833:
  if (local_78 == 0) {
    __assert_fail("n0",
                  "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/mergesort_lcp.cpp"
                  ,0x527,
                  "void merge_cache_lcp_2way(unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict, size_t, unsigned char **, lcp_t *__restrict, CharT *__restrict) [OutputLCP = false, CharT = unsigned short]"
                 );
  }
LAB_001ce84b:
  memmove(__dest,from0,local_78 << 3);
  return;
}

Assistant:

void
merge_cache_lcp_2way(
       unsigned char** from0,  lcp_t* restrict lcp_input0, CharT* restrict cache_input0, size_t n0,
       unsigned char** from1,  lcp_t* restrict lcp_input1, CharT* restrict cache_input1, size_t n1,
       unsigned char** result, lcp_t* restrict lcp_result, CharT* restrict cache_result)
{
	debug() << __func__ << "(): n0=" << n0 << ", n1=" << n1 << '\n';

	check_input(from0, lcp_input0, cache_input0, n0);
	check_input(from1, lcp_input1, cache_input1, n1);

	lcp_t lcp0=0, lcp1=0;
	CharT cache0 = *cache_input0++;
	CharT cache1 = *cache_input1++;
	{
		stat_try_cache();
		if (cache0 < cache1) {
			assert(cmp(*from0, *from1) < 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache1 = get_char<CharT>(*from1, l);
				}
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				lcp1 = l;
				cache0 = *cache_input0++;
			} else {
				*result++ = *from0++;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
			}
			if (--n0 == 0) goto finish0;
		} else if (cache0 > cache1) {
			assert(cmp(*from0, *from1) > 0);
			if (sizeof(CharT) > 1) {
				const int l = lcp(cache0, cache1);
				if (l > 0) {
					cache0 = get_char<CharT>(*from0, l);
				}
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp0 = l;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			} else {
				*result++ = *from1++;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
			}
			if (--n1 == 0) goto finish1;
		} else {
			if (is_end(cache0)) {
				assert(cmp(*from0, *from1) == 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = l;
					cache0 = *cache_input0++;
					cache1 = 0;
				} else {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					cache0 = *cache_input0++;
					cache1 = 0;
				}
				if (--n0 == 0) goto finish0;
			} else {
				stat_cache_useless();
				int cmp01; lcp_t lcp01;
				std::tie(cmp01, lcp01) = compare(*from0, *from1, sizeof(CharT));
				if (cmp01 < 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = get_char<CharT>(*from1, lcp01);
					if (--n0 == 0) goto finish0;
				} else if (cmp01 == 0) {
					*result++ = *from0++;
					if (OutputLCP) *cache_result++ = cache0;
					lcp0 = *lcp_input0++;
					lcp1 = lcp01;
					cache0 = *cache_input0++;
					cache1 = 0;
					if (--n0 == 0) goto finish0;
				} else {
					*result++ = *from1++;
					if (OutputLCP) *cache_result++ = cache1;
					lcp0 = lcp01;
					lcp1 = *lcp_input1++;
					cache0 = get_char<CharT>(*from0, lcp01);
					cache1 = *cache_input1++;
					if (--n1 == 0) goto finish1;
				}
			}
		}
	}
	while (true) {
		debug() << "Starting loop, n0="<<n0<<", n1="<<n1<<" ...\n"
			<< "\tprev   = '"<<*(result-1)<<"'\n"
			<< "\t*from0 = '"<<*from0<<"'\n"
			<< "\t*from1 = '"<<*from1<<"'\n"
			<< "\tlcp0   = " <<lcp0<<"\n"
			<< "\tlcp1   = " <<lcp1<<"\n"
			<< "\tcache0 = '"<<to_str(cache0)<<"'\n"
			<< "\tcache1 = '"<<to_str(cache1)<<"'\n"
			<< "\n";
		check_lcp_and_cache(*(result-1),*from0,lcp0,cache0,*from1,lcp1,cache1);
		if (lcp0 > lcp1) {
			debug() << "\tlcp0 > lcp1\n";
			assert(cmp(*from0, *from1) < 0);
			*result++ = *from0++;
			if (OutputLCP) *lcp_result++ = lcp0;
			if (OutputLCP) *cache_result++ = cache0;
			lcp0 = *lcp_input0++;
			cache0 = *cache_input0++;
			if (--n0 == 0) goto finish0;
		} else if (lcp0 < lcp1) {
			debug() << "\tlcp0 < lcp1\n";
			assert(cmp(*from0, *from1) > 0);
			*result++ = *from1++;
			if (OutputLCP) *lcp_result++ = lcp1;
			if (OutputLCP) *cache_result++ = cache1;
			lcp1 = *lcp_input1++;
			cache1 = *cache_input1++;
			if (--n1 == 0) goto finish1;
		} else {
			debug() << "\tlcp0 == lcp1\n";
			stat_try_cache();
			// Both strings in the sorted sequences have the same
			// prefix than the latest string in output. Check
			// cached characters first.
			if (cache0 < cache1) {
				debug() << "\t\tcache0 < cache1\n";
				assert(cmp(*from0, *from1) < 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp1 += l;
						cache1 = get_char<CharT>(*from1, lcp1);
					}
				}
				*result++ = *from0++;
				if (OutputLCP) *lcp_result++ = lcp0;
				if (OutputLCP) *cache_result++ = cache0;
				lcp0 = *lcp_input0++;
				cache0 = *cache_input0++;
				if (--n0 == 0) goto finish0;
			} else if (cache0 > cache1) {
				debug() << "\t\tcache0 > cache1\n";
				assert(cmp(*from0, *from1) > 0);
				if (sizeof(CharT) > 1) {
					const int l = lcp(cache0, cache1);
					if (l > 0) {
						lcp0 += l;
						cache0 = get_char<CharT>(*from0, lcp0);
					}
				}
				*result++ = *from1++;
				if (OutputLCP) *lcp_result++ = lcp1;
				if (OutputLCP) *cache_result++ = cache1;
				lcp1 = *lcp_input1++;
				cache1 = *cache_input1++;
				if (--n1 == 0) goto finish1;
			} else {
				debug() << "\t\tcache0 == cache1\n";
				if (is_end(cache0)) {
					assert(cmp(*from0, *from1) == 0);
					if (sizeof(CharT) > 1) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 += lcp(cache0, cache1);
						cache0 = *cache_input0++;
						cache1 = 0;
					} else {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						cache0 = *cache_input0++;
					}
					if (--n0 == 0) goto finish0;
				} else {
					stat_cache_useless();
					int cmp01; lcp_t lcp01;
					std::tie(cmp01, lcp01) = compare(*from0, *from1, lcp0+sizeof(CharT));
					if (cmp01 < 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = get_char<CharT>(*from1, lcp01);
						if (--n0 == 0) goto finish0;
					} else if (cmp01 == 0) {
						*result++ = *from0++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = *lcp_input0++;
						lcp1 = lcp01;
						cache0 = *cache_input0++;
						cache1 = 0;
						if (--n0 == 0) goto finish0;
					} else {
						*result++ = *from1++;
						if (OutputLCP) *lcp_result++ = lcp0 /* == lcp1 */;
						if (OutputLCP) *cache_result++ = cache0 /* == cache1 */;
						lcp0 = lcp01;
						lcp1 = *lcp_input1++;
						cache0 = get_char<CharT>(*from0, lcp01);
						cache1 = *cache_input1++;
						if (--n1 == 0) goto finish1;
					}
				}
			}
		}
	}
finish0:
	assert(n0==0);
	assert(n1);
	if (OutputLCP) *lcp_result++ = lcp1;
	if (OutputLCP) *cache_result++ = cache1;
	std::copy(from1, from1+n1, result);
	if (OutputLCP) std::copy(lcp_input1, lcp_input1+n1, lcp_result);
	if (OutputLCP) std::copy(cache_input1, cache_input1+n1, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
finish1:
	assert(n0);
	assert(n1==0);
	if (OutputLCP) *lcp_result++ = lcp0;
	if (OutputLCP) *cache_result++ = cache0;
	std::copy(from0, from0+n0, result);
	if (OutputLCP) std::copy(lcp_input0, lcp_input0+n0, lcp_result);
	if (OutputLCP) std::copy(cache_input0, cache_input0+n0, cache_result);
	debug() << '~' << __func__ << '\n';
	return;
}